

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpiod_if2.c
# Opt level: O3

int spi_read(int pi,uint handle,char *buf,uint count)

{
  int __state;
  int sent;
  
  sent = pigpio_command(pi,0x49,handle,count,0);
  if (0 < sent) {
    sent = recvMax(pi,buf,count,sent);
  }
  __state = gCancelState[pi];
  pthread_mutex_unlock((pthread_mutex_t *)(gCmdMutex + pi));
  pthread_setcancelstate(__state,(int *)0x0);
  return sent;
}

Assistant:

int spi_read(int pi, unsigned handle, char *buf, unsigned count)
{
   int bytes;

   bytes = pigpio_command
      (pi, PI_CMD_SPIR, handle, count, 0);

   if (bytes > 0)
   {
      bytes = recvMax(pi, buf, count, bytes);
   }

   _pmu(pi);

   return bytes;
}